

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O2

void __thiscall HighsMipSolver::cleanupSolve(HighsMipSolver *this)

{
  HighsMipAnalysis *this_00;
  double *pdVar1;
  HighsMipSolverData *pHVar2;
  HighsOptions *pHVar3;
  bool bVar4;
  bool bVar5;
  char *__format;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qa;
  double dVar9;
  double dVar10;
  array<char,_32UL> gapValString;
  string solutionstatus;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  array<char,_32UL> gapTolString;
  
  HighsMipSolverData::printDisplayLine
            ((this->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,0xf);
  this_00 = &this->analysis_;
  bVar4 = HighsMipAnalysis::mipTimerRunning(this_00,2);
  if (bVar4) {
    HighsMipAnalysis::mipTimerStop(this_00,2);
  }
  pHVar2 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HighsMipSolverData::updatePrimalDualIntegral
            (pHVar2,pHVar2->lower_bound,pHVar2->lower_bound,pHVar2->upper_bound,pHVar2->upper_bound,
             false,true);
  HighsMipAnalysis::mipTimerStart(this_00,3);
  dVar8 = this->solution_objective_;
  bVar4 = true;
  if (((dVar8 < INFINITY) &&
      (dVar7 = (this->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance,
      this->bound_violation_ <= dVar7)) && (this->integrality_violation_ <= dVar7)) {
    bVar4 = dVar7 < this->row_violation_;
  }
  pHVar2 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  dVar7 = pHVar2->lower_bound;
  this->dual_bound_ = dVar7;
  dVar9 = (pHVar2->objectiveFunction).objIntScale;
  if ((dVar9 != 0.0) || (dVar10 = dVar7, NAN(dVar9))) {
    dVar6 = ceil(dVar7 * dVar9 - pHVar2->feastol);
    dVar10 = dVar6 / dVar9;
    if (dVar6 / dVar9 <= dVar7) {
      dVar10 = dVar7;
    }
    this->dual_bound_ = dVar10;
  }
  dVar7 = this->model_->offset_;
  dVar10 = dVar10 + dVar7;
  dVar7 = dVar7 + pHVar2->upper_bound;
  this->primal_bound_ = dVar7;
  this->node_count_ = pHVar2->num_nodes;
  this->total_lp_iterations_ = pHVar2->total_lp_iterations;
  dVar9 = dVar7;
  if (dVar10 <= dVar7) {
    dVar9 = dVar10;
  }
  this->dual_bound_ = dVar9;
  this->primal_dual_integral_ = (pHVar2->primal_dual_integral).value;
  if (this->orig_model_->sense_ == kMaximize) {
    this->dual_bound_ = -dVar9;
    this->primal_bound_ = -dVar7;
  }
  if ((this->modelstatus_ & ~kInfeasible) == kMin) {
    this->modelstatus_ = (byte)(INFINITY <= dVar8 | bVar4) + kOptimal;
  }
  HighsMipAnalysis::mipTimerStop(this_00,3);
  HighsTimer::stop(&this->timer_,0);
  std::__cxx11::string::string((string *)&solutionstatus,"-",(allocator *)&local_c8);
  if (dVar8 < INFINITY) {
    std::__cxx11::string::assign((char *)&solutionstatus);
  }
  dVar8 = this->dual_bound_;
  dVar7 = this->primal_bound_;
  this->gap_ = ABS(dVar7 - dVar8);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    if (dVar7 < INFINITY) {
      dVar8 = ABS((dVar7 - dVar8) / dVar7);
      goto LAB_002bd6c6;
    }
    this->gap_ = INFINITY;
  }
  else {
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = INFINITY;
    }
    else {
      dVar8 = 0.0;
    }
LAB_002bd6c6:
    this->gap_ = dVar8;
    local_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_98 = 0;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_a8 = 0;
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    local_b8 = 0;
    uStack_b4 = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
    local_c8 = 0;
    uStack_c4 = 0;
    uStack_c0 = 0;
    uStack_bc = 0;
    if (dVar8 < INFINITY) {
      dVar7 = dVar8 * 0.1;
      if (0.01 <= dVar7) {
        dVar7 = 0.01;
      }
      dVar9 = 1e-06;
      if (1e-06 <= dVar7) {
        dVar9 = dVar7;
      }
      highsDoubleToString(&gapValString,dVar8 * 100.0,dVar9);
      pHVar3 = this->options_mip_;
      dVar8 = (pHVar3->super_HighsOptionsStruct).mip_rel_gap;
      dVar7 = (pHVar3->super_HighsOptionsStruct).mip_abs_gap;
      pdVar1 = &(pHVar3->super_HighsOptionsStruct).mip_feasibility_tolerance;
      dVar9 = dVar8;
      if (dVar7 < *pdVar1 || dVar7 == *pdVar1) {
LAB_002bd7a0:
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          if (dVar9 < INFINITY) {
            dVar8 = dVar9 * 0.1;
            if (0.01 <= dVar8) {
              dVar8 = 0.01;
            }
            dVar7 = 1e-06;
            if (1e-06 <= dVar8) {
              dVar7 = dVar8;
            }
            highsDoubleToString(&gapTolString,dVar9 * 100.0,dVar7);
            snprintf((char *)&local_c8,0x80,"%s%% (tolerance: %s%%)",&gapValString,&gapTolString);
            goto LAB_002bd8ab;
          }
          goto LAB_002bd88b;
        }
        __format = "%s%%";
      }
      else {
        dVar10 = this->primal_bound_;
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          dVar9 = dVar7 / ABS(dVar10);
          if (dVar7 / ABS(dVar10) <= dVar8) {
            dVar9 = dVar8;
          }
          goto LAB_002bd7a0;
        }
LAB_002bd88b:
        __format = "%s%% (tolerance: inf)";
      }
      snprintf((char *)&local_c8,0x80,__format,&gapValString);
      goto LAB_002bd8ab;
    }
  }
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  local_68 = 0;
  uStack_6c = 0;
  uStack_70 = 0;
  uStack_74 = 0;
  local_78 = 0;
  uStack_7c = 0;
  uStack_80 = 0;
  uStack_84 = 0;
  local_88 = 0;
  uStack_8c = 0;
  uStack_90 = 0;
  uStack_94 = 0;
  local_98 = 0;
  uStack_9c = 0;
  uStack_a0 = 0;
  uStack_a4 = 0;
  local_a8 = 0;
  uStack_ac = 0;
  uStack_b0 = 0;
  uStack_b4 = 0;
  local_b8 = 0;
  uStack_bc = 0;
  uStack_c0 = 0;
  uStack_c4 = 0;
  uStack_50 = 0;
  uStack_54 = 0;
  local_c8 = 0x666e69;
LAB_002bd8ab:
  bVar4 = (this->options_mip_->super_HighsOptionsStruct).timeless_log;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "\nSolving report\n");
  if ((this->orig_model_->model_name_)._M_string_length != 0) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "  Model             %s\n",(this->orig_model_->model_name_)._M_dataplus._M_p);
  }
  pHVar3 = this->options_mip_;
  utilModelStatusToString_abi_cxx11_((string *)&gapValString,this->modelstatus_);
  highsLogUser(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,
               "  Status            %s\n  Primal bound      %.12g\n  Dual bound        %.12g\n  Gap               %s\n"
               ,this->primal_bound_,this->dual_bound_,gapValString._M_elems._0_8_,&local_c8);
  std::__cxx11::string::~string((string *)&gapValString);
  if (bVar4 == false) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "  P-D integral      %.12g\n",
                 (((this->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                 primal_dual_integral).value);
  }
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "  Solution status   %s\n");
  bVar5 = std::operator!=(&solutionstatus,"-");
  __buf = extraout_RDX;
  if (bVar5) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "                    %.12g (objective)\n                    %.12g (bound viol.)\n                    %.12g (int. viol.)\n                    %.12g (row viol.)\n"
                 ,this->solution_objective_,this->bound_violation_,this->integrality_violation_,
                 this->row_violation_);
    __buf = extraout_RDX_00;
  }
  if (bVar4 == false) {
    pHVar3 = this->options_mip_;
    HighsTimer::read(&this->timer_,0,__buf,(size_t)solutionstatus._M_dataplus._M_p);
    dVar8 = HighsMipAnalysis::mipTimerRead(this_00,1);
    dVar7 = HighsMipAnalysis::mipTimerRead(this_00,2);
    dVar9 = HighsMipAnalysis::mipTimerRead(this_00,3);
    highsLogUser(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,
                 "  Timing            %.2f (total)\n                    %.2f (presolve)\n                    %.2f (solve)\n                    %.2f (postsolve)\n"
                 ,extraout_XMM0_Qa,dVar8,dVar7,dVar9);
  }
  pHVar2 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "  Max sub-MIP depth %d\n  Nodes             %llu\n  Repair LPs        %llu (%llu feasible; %llu iterations)\n  LP iterations     %llu (total)\n                    %llu (strong br.)\n                    %llu (separation)\n                    %llu (heuristics)\n"
               ,(ulong)(uint)this->max_submip_level,pHVar2->num_nodes,pHVar2->total_repair_lp,
               pHVar2->total_repair_lp_feasible,pHVar2->total_repair_lp_iterations,
               pHVar2->total_lp_iterations,pHVar2->sb_lp_iterations,pHVar2->sepa_lp_iterations,
               pHVar2->heuristic_lp_iterations);
  if (bVar4 == false) {
    HighsMipAnalysis::reportMipTimer(this_00);
  }
  std::__cxx11::string::~string((string *)&solutionstatus);
  return;
}

Assistant:

void HighsMipSolver::cleanupSolve() {
  // Force a final logging line
  mipdata_->printDisplayLine(kSolutionSourceCleanup);
  // Stop the solve clock - which won't be running if presolve
  // determines the model status
  if (analysis_.mipTimerRunning(kMipClockSolve))
    analysis_.mipTimerStop(kMipClockSolve);

  // Need to complete the calculation of P-D integral, checking for NO
  // gap change
  mipdata_->updatePrimalDualIntegral(
      mipdata_->lower_bound, mipdata_->lower_bound, mipdata_->upper_bound,
      mipdata_->upper_bound, false);
  analysis_.mipTimerStart(kMipClockPostsolve);

  bool havesolution = solution_objective_ != kHighsInf;
  bool feasible;
  if (havesolution)
    feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
  else
    feasible = false;

  dual_bound_ = mipdata_->lower_bound;
  if (mipdata_->objectiveFunction.isIntegral()) {
    double rounded_lower_bound =
        std::ceil(mipdata_->lower_bound *
                      mipdata_->objectiveFunction.integralScale() -
                  mipdata_->feastol) /
        mipdata_->objectiveFunction.integralScale();
    dual_bound_ = std::max(dual_bound_, rounded_lower_bound);
  }
  dual_bound_ += model_->offset_;
  primal_bound_ = mipdata_->upper_bound + model_->offset_;
  node_count_ = mipdata_->num_nodes;
  total_lp_iterations_ = mipdata_->total_lp_iterations;
  dual_bound_ = std::min(dual_bound_, primal_bound_);
  primal_dual_integral_ = mipdata_->primal_dual_integral.value;

  // adjust objective sense in case of maximization problem
  if (orig_model_->sense_ == ObjSense::kMaximize) {
    dual_bound_ = -dual_bound_;
    primal_bound_ = -primal_bound_;
  }

  if (modelstatus_ == HighsModelStatus::kNotset ||
      modelstatus_ == HighsModelStatus::kInfeasible) {
    if (feasible && havesolution)
      modelstatus_ = HighsModelStatus::kOptimal;
    else
      modelstatus_ = HighsModelStatus::kInfeasible;
  }

  analysis_.mipTimerStop(kMipClockPostsolve);
  timer_.stop();

  std::string solutionstatus = "-";

  if (havesolution) {
    bool feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
    solutionstatus = feasible ? "feasible" : "infeasible";
  }

  gap_ = fabs(primal_bound_ - dual_bound_);
  if (primal_bound_ == 0.0)
    gap_ = dual_bound_ == 0.0 ? 0.0 : kHighsInf;
  else if (primal_bound_ != kHighsInf)
    gap_ = fabs(primal_bound_ - dual_bound_) / fabs(primal_bound_);
  else
    gap_ = kHighsInf;

  std::array<char, 128> gapString = {};

  if (gap_ == kHighsInf)
    std::strcpy(gapString.data(), "inf");
  else {
    double printTol = std::max(std::min(1e-2, 1e-1 * gap_), 1e-6);
    auto gapValString = highsDoubleToString(100.0 * gap_, printTol);
    double gapTol = options_mip_->mip_rel_gap;

    if (options_mip_->mip_abs_gap > options_mip_->mip_feasibility_tolerance) {
      gapTol = primal_bound_ == 0.0
                   ? kHighsInf
                   : std::max(gapTol,
                              options_mip_->mip_abs_gap / fabs(primal_bound_));
    }

    if (gapTol == 0.0)
      std::snprintf(gapString.data(), gapString.size(), "%s%%",
                    gapValString.data());
    else if (gapTol != kHighsInf) {
      printTol = std::max(std::min(1e-2, 1e-1 * gapTol), 1e-6);
      auto gapTolString = highsDoubleToString(100.0 * gapTol, printTol);
      std::snprintf(gapString.data(), gapString.size(),
                    "%s%% (tolerance: %s%%)", gapValString.data(),
                    gapTolString.data());
    } else
      std::snprintf(gapString.data(), gapString.size(), "%s%% (tolerance: inf)",
                    gapValString.data());
  }

  bool timeless_log = options_mip_->timeless_log;
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "\nSolving report\n");
  if (this->orig_model_->model_name_.length())
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Model             %s\n",
                 this->orig_model_->model_name_.c_str());
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Status            %s\n"
               "  Primal bound      %.12g\n"
               "  Dual bound        %.12g\n"
               "  Gap               %s\n",
               utilModelStatusToString(modelstatus_).c_str(), primal_bound_,
               dual_bound_, gapString.data());
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  P-D integral      %.12g\n",
                 mipdata_->primal_dual_integral.value);
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Solution status   %s\n", solutionstatus.c_str());
  if (solutionstatus != "-")
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "                    %.12g (objective)\n"
                 "                    %.12g (bound viol.)\n"
                 "                    %.12g (int. viol.)\n"
                 "                    %.12g (row viol.)\n",
                 solution_objective_, bound_violation_, integrality_violation_,
                 row_violation_);
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Timing            %.2f (total)\n"
                 "                    %.2f (presolve)\n"
                 "                    %.2f (solve)\n"
                 "                    %.2f (postsolve)\n",
                 timer_.read(), analysis_.mipTimerRead(kMipClockPresolve),
                 analysis_.mipTimerRead(kMipClockSolve),
                 analysis_.mipTimerRead(kMipClockPostsolve));
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Max sub-MIP depth %d\n"
               "  Nodes             %llu\n"
               "  Repair LPs        %llu (%llu feasible; %llu iterations)\n"
               "  LP iterations     %llu (total)\n"
               "                    %llu (strong br.)\n"
               "                    %llu (separation)\n"
               "                    %llu (heuristics)\n",
               int(max_submip_level), (long long unsigned)mipdata_->num_nodes,
               (long long unsigned)mipdata_->total_repair_lp,
               (long long unsigned)mipdata_->total_repair_lp_feasible,
               (long long unsigned)mipdata_->total_repair_lp_iterations,
               (long long unsigned)mipdata_->total_lp_iterations,
               (long long unsigned)mipdata_->sb_lp_iterations,
               (long long unsigned)mipdata_->sepa_lp_iterations,
               (long long unsigned)mipdata_->heuristic_lp_iterations);

  if (!timeless_log) analysis_.reportMipTimer();

  assert(modelstatus_ != HighsModelStatus::kNotset);
}